

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::UnifyConstantPass::Process(UnifyConstantPass *this)

{
  __node_base *p_Var1;
  size_type *psVar2;
  bool bVar3;
  Op OVar4;
  Op OVar5;
  IRContext *pIVar6;
  DefUseManager *this_00;
  pointer pOVar7;
  pointer pOVar8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var9;
  __node_base_ptr p_Var10;
  __buckets_ptr pp_Var11;
  long *plVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var17;
  Instruction *pIVar18;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var19;
  ulong uVar20;
  size_type __n;
  Status SVar21;
  pointer __ptr_1;
  ulong uVar22;
  Op *pOVar23;
  _Hash_node_base _Var24;
  ulong uVar25;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> _Var26;
  Instruction *__range3;
  Op *pOVar27;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var28;
  undefined1 auVar29 [16];
  __buckets_alloc_type __alloc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keys;
  ResultIdTrie defined_constants;
  new_allocator<std::__detail::_Hash_node_base_*> local_99;
  Op *local_98;
  Op *pOStack_90;
  long local_88;
  undefined8 local_80;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> local_78;
  Op local_70 [2];
  __uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_68;
  UnifyConstantPass *local_60;
  Instruction *local_58;
  Instruction *local_50;
  Op *local_48;
  _Hash_node_base *local_40;
  __uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_38;
  
  local_78._M_head_impl = (Node *)operator_new(0x40);
  (local_78._M_head_impl)->result_id_ = 0;
  *(undefined8 *)&((local_78._M_head_impl)->next_)._M_h._M_rehash_policy = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_buckets =
       &((local_78._M_head_impl)->next_)._M_h._M_single_bucket;
  ((local_78._M_head_impl)->next_)._M_h._M_bucket_count = 1;
  ((local_78._M_head_impl)->next_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_78._M_head_impl)->next_)._M_h._M_element_count = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_78._M_head_impl)->next_)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar18 = *(Instruction **)
             ((long)&(((((this->super_Pass).context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (pIVar18 == (Instruction *)0x0) {
    SVar21 = SuccessWithoutChange;
  }
  else {
    local_80 = 0;
    local_60 = this;
    do {
      local_50 = (pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      bVar3 = (local_50->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
      pIVar6 = (this->super_Pass).context_;
      if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar6);
      }
      this_00 = (pIVar6->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      uVar13 = 0;
      if (pIVar18->has_result_id_ == true) {
        uVar13 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
      }
      analysis::DefUseManager::GetAnnotations
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&local_98,this_00,uVar13);
      pOVar27 = pOStack_90;
      pOVar23 = local_98;
      if (local_98 != (Op *)0x0) {
        operator_delete(local_98,local_88 - (long)local_98);
      }
      if ((pOVar27 == pOVar23) &&
         ((OVar4 = pIVar18->opcode_, OVar4 - OpConstantTrue < 6 ||
          (OVar4 - OpSpecConstantComposite < 2)))) {
        local_98 = (Op *)0x0;
        pOStack_90 = (Op *)0x0;
        local_88 = 0;
        local_70[0] = OVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,(iterator)0x0,
                   local_70);
        pOVar7 = (pIVar18->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar8 = (pIVar18->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pOVar7 != pOVar8) {
          _Var28._M_head_impl =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&(pOVar7->words).small_data_;
          do {
            if (*(int *)((long)_Var28._M_head_impl + -0x20) != 3) {
              _Var9._M_head_impl =
                   *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    &((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)((long)_Var28._M_head_impl + 8))->_M_t;
              if ((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )_Var9._M_head_impl ==
                  (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )0x0) {
                _Var19._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(*(long *)((long)_Var28._M_head_impl + -0x10) * 4 +
                       *(long *)_Var28._M_head_impl);
                _Var9._M_head_impl = _Var28._M_head_impl;
              }
              else {
                _Var19._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl =
                     *(tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)&((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)((long)_Var9._M_head_impl + 8))->_M_t;
              }
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_range_insert<unsigned_int_const*>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,pOStack_90,
                         *(uint **)&((_Var9._M_head_impl)->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl,
                         _Var19._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl);
            }
            plVar12 = (long *)((long)_Var28._M_head_impl + 0x10);
            _Var28._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)_Var28._M_head_impl + 0x30);
          } while ((pointer)plVar12 != pOVar8);
        }
        local_48 = pOStack_90;
        pOVar23 = pOStack_90;
        _Var26._M_head_impl = local_78._M_head_impl;
        pOVar27 = local_98;
        local_58 = pIVar18;
        if (local_98 != pOStack_90) {
          do {
            OVar4 = *pOVar27;
            uVar22 = (ulong)OVar4;
            uVar25 = ((_Var26._M_head_impl)->next_)._M_h._M_bucket_count;
            uVar20 = uVar22 % uVar25;
            p_Var10 = ((_Var26._M_head_impl)->next_)._M_h._M_buckets[uVar20];
            if (p_Var10 != (__node_base_ptr)0x0) {
              p_Var15 = p_Var10->_M_nxt;
              OVar5 = *(Op *)&p_Var15[1]._M_nxt;
              do {
                if (OVar5 == OVar4) {
                  _Var26._M_head_impl = (Node *)p_Var15[2]._M_nxt;
                  goto LAB_0054fb9f;
                }
                p_Var15 = p_Var15->_M_nxt;
              } while ((p_Var15 != (_Hash_node_base *)0x0) &&
                      (OVar5 = *(Op *)&p_Var15[1]._M_nxt, (ulong)OVar5 % uVar25 == uVar20));
            }
            p_Var15 = (_Hash_node_base *)operator_new(0x40);
            *(undefined4 *)&p_Var15->_M_nxt = 0;
            p_Var15[5]._M_nxt = (_Hash_node_base *)0x0;
            p_Var15[1]._M_nxt = p_Var15 + 7;
            p_Var15[2]._M_nxt = (_Hash_node_base *)0x1;
            p_Var15[3]._M_nxt = (_Hash_node_base *)0x0;
            p_Var15[4]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined4 *)&p_Var15[5]._M_nxt = 0x3f800000;
            p_Var15[6]._M_nxt = (_Hash_node_base *)0x0;
            p_Var15[7]._M_nxt = (_Hash_node_base *)0x0;
            local_38._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
            .
            super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>
            ._M_head_impl =
                 (tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                  )(_Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                    )0x0;
            local_70[0] = OVar4;
            p_Var16 = (_Hash_node_base *)operator_new(0x18);
            p_Var16->_M_nxt = (_Hash_node_base *)0x0;
            *(Op *)&p_Var16[1]._M_nxt = OVar4;
            p_Var16[2]._M_nxt = p_Var15;
            local_68._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
            .
            super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>
            ._M_head_impl =
                 (tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                  )(_Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                    )0x0;
            uVar25 = ((_Var26._M_head_impl)->next_)._M_h._M_bucket_count;
            uVar20 = uVar22 % uVar25;
            p_Var10 = ((_Var26._M_head_impl)->next_)._M_h._M_buckets[uVar20];
            if (p_Var10 != (__node_base_ptr)0x0) {
              p_Var15 = p_Var10->_M_nxt;
              OVar5 = *(Op *)&p_Var15[1]._M_nxt;
              do {
                if (OVar5 == OVar4) {
                  std::
                  unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                  ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                                 *)(p_Var16 + 2));
                  operator_delete(p_Var16,0x18);
                  goto LAB_0054fb87;
                }
                p_Var15 = p_Var15->_M_nxt;
              } while ((p_Var15 != (_Hash_node_base *)0x0) &&
                      (OVar5 = *(Op *)&p_Var15[1]._M_nxt, (ulong)OVar5 % uVar25 == uVar20));
            }
            local_40 = p_Var16;
            auVar29 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&((_Var26._M_head_impl)->next_)._M_h._M_rehash_policy,uVar25
                                 ,((_Var26._M_head_impl)->next_)._M_h._M_element_count);
            __n = auVar29._8_8_;
            if ((auVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              __s = ((_Var26._M_head_impl)->next_)._M_h._M_buckets;
            }
            else {
              if (__n == 1) {
                __s = &((_Var26._M_head_impl)->next_)._M_h._M_single_bucket;
                ((_Var26._M_head_impl)->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
              }
              else {
                __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                (&local_99,__n,(void *)0x0);
                memset(__s,0,__n * 8);
              }
              _Var24._M_nxt = ((_Var26._M_head_impl)->next_)._M_h._M_before_begin._M_nxt;
              ((_Var26._M_head_impl)->next_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              if (_Var24._M_nxt != (_Hash_node_base *)0x0) {
                p_Var1 = &((_Var26._M_head_impl)->next_)._M_h._M_before_begin;
                uVar25 = 0;
                do {
                  p_Var15 = (_Var24._M_nxt)->_M_nxt;
                  uVar20 = (ulong)*(uint *)&_Var24._M_nxt[1]._M_nxt % __n;
                  if (__s[uVar20] == (_Hash_node_base *)0x0) {
                    (_Var24._M_nxt)->_M_nxt = p_Var1->_M_nxt;
                    p_Var1->_M_nxt = _Var24._M_nxt;
                    __s[uVar20] = p_Var1;
                    if ((_Var24._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      pp_Var17 = __s + uVar25;
                      goto LAB_0054faeb;
                    }
                  }
                  else {
                    (_Var24._M_nxt)->_M_nxt = __s[uVar20]->_M_nxt;
                    pp_Var17 = &__s[uVar20]->_M_nxt;
                    uVar20 = uVar25;
LAB_0054faeb:
                    *pp_Var17 = _Var24._M_nxt;
                  }
                  _Var24._M_nxt = p_Var15;
                  uVar25 = uVar20;
                } while (p_Var15 != (_Hash_node_base *)0x0);
              }
              pp_Var11 = ((_Var26._M_head_impl)->next_)._M_h._M_buckets;
              if (&((_Var26._M_head_impl)->next_)._M_h._M_single_bucket != pp_Var11) {
                operator_delete(pp_Var11,((_Var26._M_head_impl)->next_)._M_h._M_bucket_count << 3);
              }
              ((_Var26._M_head_impl)->next_)._M_h._M_bucket_count = __n;
              ((_Var26._M_head_impl)->next_)._M_h._M_buckets = __s;
              uVar20 = uVar22 % __n;
            }
            if (__s[uVar20] == (_Hash_node_base *)0x0) {
              p_Var15 = ((_Var26._M_head_impl)->next_)._M_h._M_before_begin._M_nxt;
              local_40->_M_nxt = p_Var15;
              ((_Var26._M_head_impl)->next_)._M_h._M_before_begin._M_nxt = local_40;
              if (p_Var15 != (_Hash_node_base *)0x0) {
                __s[(ulong)*(uint *)&p_Var15[1]._M_nxt %
                    ((_Var26._M_head_impl)->next_)._M_h._M_bucket_count] = local_40;
                __s = ((_Var26._M_head_impl)->next_)._M_h._M_buckets;
              }
              __s[uVar20] = &((_Var26._M_head_impl)->next_)._M_h._M_before_begin;
            }
            else {
              local_40->_M_nxt = __s[uVar20]->_M_nxt;
              __s[uVar20]->_M_nxt = local_40;
            }
            psVar2 = &((_Var26._M_head_impl)->next_)._M_h._M_element_count;
            *psVar2 = *psVar2 + 1;
            p_Var15 = local_40;
            pOVar23 = local_48;
LAB_0054fb87:
            _Var26._M_head_impl = (Node *)p_Var15[2]._M_nxt;
            std::
            unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                           *)&local_68);
            std::
            unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                           *)&local_38);
LAB_0054fb9f:
            pOVar27 = pOVar27 + 1;
          } while (pOVar27 != pOVar23);
        }
        pIVar18 = local_58;
        uVar13 = (_Var26._M_head_impl)->result_id_;
        if (uVar13 == 0) {
          uVar13 = 0;
          if (local_58->has_result_id_ == true) {
            uVar13 = Instruction::GetSingleWordOperand(local_58,(uint)local_58->has_type_id_);
          }
          (_Var26._M_head_impl)->result_id_ = uVar13;
        }
        if (local_98 != (Op *)0x0) {
          operator_delete(local_98,local_88 - (long)local_98);
        }
        this = local_60;
        uVar14 = 0;
        if (pIVar18->has_result_id_ == true) {
          uVar14 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
        }
        if (uVar13 != uVar14) {
          pIVar6 = (this->super_Pass).context_;
          uVar14 = 0;
          if (pIVar18->has_result_id_ == true) {
            uVar14 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
          }
          IRContext::ReplaceAllUsesWith(pIVar6,uVar14,uVar13);
          pIVar18 = IRContext::KillInst((this->super_Pass).context_,pIVar18);
          local_80 = CONCAT71((int7)((ulong)pIVar18 >> 8),1);
        }
      }
    } while ((local_50 != (Instruction *)0x0) && (pIVar18 = local_50, bVar3 == false));
    SVar21 = (byte)local_80 & 1 ^ SuccessWithoutChange;
  }
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                 *)&local_78);
  return SVar21;
}

Assistant:

Pass::Status UnifyConstantPass::Process() {
  bool modified = false;
  ResultIdTrie defined_constants;

  for (Instruction *next_instruction,
       *inst = &*(context()->types_values_begin());
       inst; inst = next_instruction) {
    next_instruction = inst->NextNode();

    // Do not handle the instruction when there are decorations upon the result
    // id.
    if (get_def_use_mgr()->GetAnnotations(inst->result_id()).size() != 0) {
      continue;
    }

    // The overall algorithm is to store the result ids of all the eligible
    // constants encountered so far in a trie. For a constant defining
    // instruction under consideration, use its opcode, result type id and
    // words in operands as an array of keys to lookup the trie. If a result id
    // can be found for that array of keys, a constant with exactly the same
    // value must has been defined before, the constant under processing
    // should be replaced by the constant previously defined. If no such result
    // id can be found for that array of keys, this must be the first time a
    // constant with its value be defined, we then create a new trie node to
    // store the result id with the keys. When replacing a duplicated constant
    // with a previously defined constant, all the uses of the duplicated
    // constant, which must be placed after the duplicated constant defining
    // instruction, will be updated. This way, the descendants of the
    // previously defined constant and the duplicated constant will both refer
    // to the previously defined constant. So that the operand ids which are
    // used in key arrays will be the ids of the unified constants, when
    // processing is up to a descendant. This makes comparing the key array
    // always valid for judging duplication.
    switch (inst->opcode()) {
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantSampler:
      case spv::Op::OpConstantComposite:
      // Only spec constants defined with OpSpecConstantOp and
      // OpSpecConstantComposite should be processed in this pass. Spec
      // constants defined with OpSpecConstant{|True|False} are decorated with
      // 'SpecId' decoration and all of them should be treated as unique.
      // 'SpecId' is not applicable to SpecConstants defined with
      // OpSpecConstant{Op|Composite}, their values are not necessary to be
      // unique. When all the operands/components are the same between two
      // OpSpecConstant{Op|Composite} results, their result values must be the
      // same so are unifiable.
      case spv::Op::OpSpecConstantOp:
      case spv::Op::OpSpecConstantComposite: {
        uint32_t id = defined_constants.LookupEquivalentResultFor(*inst);
        if (id != inst->result_id()) {
          // The constant is a duplicated one, use the cached constant to
          // replace the uses of this duplicated one, then turn it to nop.
          context()->ReplaceAllUsesWith(inst->result_id(), id);
          context()->KillInst(inst);
          modified = true;
        }
        break;
      }
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}